

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O1

bool __thiscall
dxil_spv::emit_dxil_std450_unary_instruction
          (dxil_spv *this,GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  uint32_t lit;
  bool bVar1;
  bool bVar2;
  ValueKind VVar3;
  Id IVar4;
  BinaryOps BVar5;
  uint uVar6;
  uint uVar7;
  Id type_id;
  Builder *pBVar8;
  Value *pVVar9;
  Instruction *pIVar10;
  Operation *this_00;
  BinaryOperator *this_01;
  Value *pVVar11;
  CallInst *this_02;
  BinaryOperator *pBVar12;
  Value *value;
  Value *pVVar13;
  Value *value_00;
  APFloat *this_03;
  Type *pTVar14;
  Operation *this_04;
  LoggingCallback p_Var15;
  void *pvVar16;
  byte bVar17;
  undefined4 in_register_00000034;
  Impl *this_05;
  byte bVar18;
  CallInst *this_06;
  double dVar19;
  double dVar20;
  pair<const_LLVMBC::Value_*,_double> pVar21;
  pair<const_LLVMBC::Value_*,_double> pVar22;
  String local_1038 [128];
  
  this_05 = (Impl *)CONCAT44(in_register_00000034,opcode);
  pBVar8 = Converter::Impl::builder(this_05);
  lit = (uint32_t)this;
  if (lit - 0x1d < 2) {
    local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
               local_1038,"dx.precise","");
    bVar1 = LLVMBC::Instruction::hasMetadata((Instruction *)impl,local_1038);
    bVar2 = (this_05->options).force_precise;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      free_in_thread(local_1038[0]._M_dataplus._M_p);
    }
    if (!bVar1 && (bVar2 & 1U) == 0) {
      if (lit == 0x1d) {
        pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,1);
        bVar2 = value_is_dx_op_instrinsic(pVVar9,Log);
        if (!bVar2) goto LAB_00167c7f;
      }
      else {
LAB_00167c7f:
        pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,1);
        bVar2 = value_is_dx_op_instrinsic(pVVar9,Exp);
        if (!bVar2) goto LAB_00167cf2;
      }
      pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,1);
      pIVar10 = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar9);
      VVar3 = LLVMBC::Value::get_value_kind((Value *)pIVar10);
      if (VVar3 == Call) {
        pVVar9 = LLVMBC::Instruction::getOperand(pIVar10,1);
        IVar4 = Converter::Impl::get_id_for_value(this_05,pVVar9,0);
        Converter::Impl::rewrite_value(this_05,(Value *)impl,IVar4);
        return true;
      }
      p_Var15 = get_thread_log_callback();
      if (p_Var15 == (LoggingCallback)0x0) {
        emit_dxil_std450_unary_instruction();
        std::terminate();
      }
      goto LAB_00168142;
    }
  }
LAB_00167cf2:
  if (this_05->glsl_std450_ext == 0) {
    IVar4 = spv::Builder::import(pBVar8,"GLSL.std.450");
    this_05->glsl_std450_ext = IVar4;
  }
  this_00 = Converter::Impl::allocate(this_05,OpExtInst,(Value *)impl);
  Operation::add_id(this_00,this_05->glsl_std450_ext);
  Operation::add_literal(this_00,lit);
  pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,1);
  IVar4 = Converter::Impl::get_id_for_value(this_05,pVVar9,0);
  if (lit != 0x1f) goto LAB_001680ac;
  pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,1);
  if (pVVar9 == (Value *)0x0) {
    pBVar12 = (BinaryOperator *)0x0;
  }
  else {
    this_01 = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(pVVar9);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)this_01);
    pBVar12 = (BinaryOperator *)0x0;
    if (VVar3 == BinaryOperator) {
      pBVar12 = this_01;
    }
  }
  if (((pBVar12 == (BinaryOperator *)0x0) ||
      (BVar5 = LLVMBC::BinaryOperator::getOpcode(pBVar12), BVar5 != FSub)) ||
     (bVar2 = LLVMBC::BinaryOperator::isFast(pBVar12), !bVar2)) goto LAB_001680ac;
  pVVar11 = LLVMBC::Instruction::getOperand(&pBVar12->super_Instruction,0);
  this_06 = (CallInst *)0x0;
  if (pVVar11 != (Value *)0x0) {
    this_02 = (CallInst *)LLVMBC::Internal::resolve_proxy(pVVar11);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)this_02);
    instruction = (CallInst *)0x0;
    this_06 = (CallInst *)0x0;
    if (VVar3 == ConstantFP) {
      instruction = this_02;
      this_06 = this_02;
    }
  }
  bVar17 = (byte)instruction;
  if (this_06 == (CallInst *)0x0) goto LAB_001680ac;
  pVVar11 = LLVMBC::Instruction::getOperand(&pBVar12->super_Instruction,1);
  pVar21 = split_constant_multipliers(pVVar11);
  dVar20 = pVar21.second;
  if (pVar21.first == (Value *)0x0) {
    bVar18 = 1;
  }
  else {
    pBVar12 = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(pVar21.first);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)pBVar12);
    dVar19 = 0.0;
    if (VVar3 == BinaryOperator) {
      BVar5 = LLVMBC::BinaryOperator::getOpcode(pBVar12);
      bVar18 = 1;
      if (BVar5 == FMul) {
        pVVar11 = LLVMBC::Instruction::getOperand((Instruction *)pBVar12,0);
        value = LLVMBC::Instruction::getOperand((Instruction *)pBVar12,1);
        pVar21 = split_constant_multipliers(pVVar11);
        pVVar13 = pVar21.first;
        pVar22 = split_constant_multipliers(value);
        value_00 = pVar22.first;
        dVar19 = 0.0;
        bVar17 = -(0.0 <= pVar22.second && 0.0 <= pVar21.second);
        if ((bVar17 & 1) != 0) {
          if (pVVar13 != (Value *)0x0) {
            pVVar11 = pVVar13;
          }
          if (value_00 != (Value *)0x0) {
            value = value_00;
          }
          bVar2 = is_canonically_normalizing_value(pVVar13);
          bVar1 = is_canonically_normalizing_value(value_00);
          pVVar13 = pVVar11;
          if (bVar2) {
            pVVar13 = value;
          }
          bVar17 = 1;
          if (!bVar1 && !bVar2) {
            bVar18 = 0;
            goto LAB_00167fe3;
          }
          if (bVar2) {
            value = pVVar11;
          }
          pIVar10 = (Instruction *)LLVMBC::Internal::resolve_proxy(value);
          VVar3 = LLVMBC::Value::get_value_kind((Value *)pIVar10);
          if (VVar3 != Call) {
            p_Var15 = get_thread_log_callback();
            if (p_Var15 == (LoggingCallback)0x0) {
              emit_dxil_std450_unary_instruction();
              std::terminate();
            }
LAB_00168142:
            local_1038[0].field_2._M_allocated_capacity._0_5_ = 0x6163206e69;
            local_1038[0].field_2._5_1_ = 's';
            local_1038[0].field_2._6_1_ = 't';
            local_1038[0].field_2._7_1_ = '<';
            local_1038[0].field_2._8_1_ = 'T';
            local_1038[0].field_2._9_1_ = '>';
            local_1038[0].field_2._10_1_ = '.';
            local_1038[0].field_2._11_1_ = '\n';
            local_1038[0].field_2._12_1_ = '\0';
            local_1038[0]._M_dataplus._M_p = (pointer)0x2064696c61766e49;
            local_1038[0]._M_string_length._0_5_ = 0x2065707974;
            local_1038[0]._M_string_length._5_3_ = 0x204449;
            pvVar16 = get_thread_log_callback_userdata();
            (*p_Var15)(pvVar16,Error,(char *)local_1038);
            std::terminate();
          }
          pVVar11 = LLVMBC::Instruction::getOperand(pIVar10,1);
          pIVar10 = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar11);
          VVar3 = LLVMBC::Value::get_value_kind((Value *)pIVar10);
          if (VVar3 != Call) {
            p_Var15 = get_thread_log_callback();
            if (p_Var15 == (LoggingCallback)0x0) {
              emit_dxil_std450_unary_instruction();
              std::terminate();
            }
            goto LAB_00168142;
          }
          uVar6 = LLVMBC::Instruction::getNumOperands(pIVar10);
          if (uVar6 < 2) {
LAB_001680f8:
            bVar18 = 0;
            dVar19 = 0.0;
          }
          else {
            pVVar11 = LLVMBC::Instruction::getOperand(pIVar10,1);
            if (pVVar11 != pVVar13) {
              uVar6 = 2;
              do {
                uVar7 = LLVMBC::Instruction::getNumOperands(pIVar10);
                if (uVar7 <= uVar6) goto LAB_001680f8;
                pVVar11 = LLVMBC::Instruction::getOperand(pIVar10,uVar6);
                uVar6 = uVar6 + 1;
              } while (pVVar11 != pVVar13);
            }
            dVar19 = dVar20 * pVar21.second * pVar22.second;
            bVar18 = 1;
          }
          bVar17 = 1;
        }
      }
      else {
        bVar17 = 0;
        bVar18 = 1;
LAB_00167fe3:
        dVar19 = 0.0;
      }
    }
    else {
      bVar18 = 0;
    }
    bVar18 = bVar18 & bVar17;
    dVar20 = dVar19;
  }
  if (bVar18 != 0) {
    this_03 = LLVMBC::Constant::getValueAPF((Constant *)this_06);
    dVar19 = LLVMBC::APFloat::convertToDouble(this_03);
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      if ((dVar19 == dVar20) && (!NAN(dVar19) && !NAN(dVar20))) {
        pTVar14 = LLVMBC::Value::getType(pVVar9);
        type_id = Converter::Impl::get_type_id(this_05,pTVar14,0);
        this_04 = Converter::Impl::allocate(this_05,OpExtInst,type_id);
        Operation::add_id(this_04,this_05->glsl_std450_ext);
        Operation::add_literal(this_04,0x28);
        Operation::add_id(this_04,IVar4);
        pBVar8 = Converter::Impl::builder(this_05);
        IVar4 = spv::Builder::makeNullConstant(pBVar8,this_04->type_id);
        Operation::add_id(this_04,IVar4);
        Converter::Impl::add(this_05,this_04,false);
        IVar4 = this_04->id;
      }
    }
  }
LAB_001680ac:
  Operation::add_id(this_00,IVar4);
  Converter::Impl::add(this_05,this_00,false);
  pTVar14 = LLVMBC::Value::getType((Value *)impl);
  Converter::Impl::decorate_relaxed_precision(this_05,pTVar14,this_00->id,false);
  return true;
}

Assistant:

bool emit_dxil_std450_unary_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// Games rely on this peephole, since DXC doesn't do it for us.
	if (opcode == GLSLstd450Exp2 || opcode == GLSLstd450Log2)
	{
		bool precise = instruction->hasMetadata("dx.precise") || impl.options.force_precise;
		if (!precise)
		{
			if ((opcode == GLSLstd450Exp2 && value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Log)) ||
			    (value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Exp)))
			{
				auto *base_value = llvm::cast<llvm::CallInst>(instruction->getOperand(1))->getOperand(1);
				impl.rewrite_value(instruction, impl.get_id_for_value(base_value));
				return true;
			}
		}
	}

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	Operation *op = impl.allocate(spv::OpExtInst, instruction);
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);

	spv::Id id = impl.get_id_for_value(instruction->getOperand(1));
	if (opcode == GLSLstd450Sqrt)
		id = build_clamped_non_negative_sqrt(impl, id, instruction->getOperand(1));

	op->add_id(id);

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}